

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_72914c1::GeneratorStateHelper::~GeneratorStateHelper(GeneratorStateHelper *this)

{
  JavascriptGenerator *pJVar1;
  ByteCodeReader *this_00;
  uint uVar2;
  uint uVar3;
  ByteBlock *this_01;
  
  pJVar1 = this->generator;
  this_00 = (ByteCodeReader *)(pJVar1->frame).ptr;
  if ((this_00 != (ByteCodeReader *)0x0) && (this->didThrow == false)) {
    uVar2 = Js::ByteCodeReader::GetCurrentOffset(this_00);
    this_01 = Js::FunctionBody::GetByteCode((FunctionBody *)this_00[5].m_endLocation);
    uVar3 = Js::ByteBlock::GetLength(this_01);
    if (uVar2 != uVar3 - 1) {
      pJVar1->state = Suspended;
      return;
    }
  }
  pJVar1->state = Completed;
  (pJVar1->frame).ptr = (InterpreterStackFrame *)0x0;
  (pJVar1->args).Values = (Type)0x0;
  (pJVar1->scriptFunction).ptr = (ScriptFunction *)0x0;
  return;
}

Assistant:

~GeneratorStateHelper()
        {
            generator->SetState(IsDone() ? GeneratorState::Completed : GeneratorState::Suspended);
        }